

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listmenu.cpp
# Opt level: O3

void __thiscall
FListMenuItemPatch::FListMenuItemPatch
          (FListMenuItemPatch *this,int x,int y,int height,int hotkey,FTextureID patch,FName *child,
          int param)

{
  int iVar1;
  
  iVar1 = child->Index;
  (this->super_FListMenuItemSelectable).super_FListMenuItem.mXpos = x;
  (this->super_FListMenuItemSelectable).super_FListMenuItem.mYpos = y;
  (this->super_FListMenuItemSelectable).super_FListMenuItem.mAction.Index = iVar1;
  (this->super_FListMenuItemSelectable).super_FListMenuItem.mEnabled = true;
  (this->super_FListMenuItemSelectable).mHeight = height;
  (this->super_FListMenuItemSelectable).mParam = param;
  (this->super_FListMenuItemSelectable).super_FListMenuItem._vptr_FListMenuItem =
       (_func_int **)&PTR__FListMenuItem_008652d8;
  (this->super_FListMenuItemSelectable).mHotkey = hotkey;
  *(int *)&(this->super_FListMenuItemSelectable).field_0x24 = patch.texnum;
  return;
}

Assistant:

FListMenuItemPatch::FListMenuItemPatch(int x, int y, int height, int hotkey, FTextureID patch, FName child, int param)
: FListMenuItemSelectable(x, y, height, child, param)
{
	mHotkey = hotkey;
	mTexture = patch;
}